

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

char base64_decode_value(char value)

{
  int iVar1;
  char local_9;
  int codepos;
  char value_local;
  
  iVar1 = value + -0x2b;
  if ((iVar1 < 0) || (0x50 < iVar1)) {
    local_9 = -1;
  }
  else {
    local_9 = base64_decode_value::decoding[iVar1];
  }
  return local_9;
}

Assistant:

static char
base64_decode_value(char value)
{
	static const char decoding[] = {
		62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58,
		59, 60, 61, -1, -1, -1, -2, -1, -1, -1,  0,  1,
		2,   3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13,
		14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25,
		-1, -1, -1, -1, -1, -1, 26, 27, 28, 29, 30, 31,
		32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42, 43,
		44, 45, 46, 47, 48, 49, 50, 51
	};
	static const char decoding_size = sizeof(decoding);
	int codepos = (signed char) value;
	codepos -= 43;
	if (codepos < 0 || codepos > decoding_size)
		return -1;
	return decoding[codepos];
}